

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lights.cpp
# Opt level: O0

void __thiscall DStrobe::DStrobe(DStrobe *this,sector_t *sector,int utics,int ltics,bool inSync)

{
  int iVar1;
  uint uVar2;
  int local_44;
  bool inSync_local;
  int ltics_local;
  int utics_local;
  sector_t *sector_local;
  DStrobe *this_local;
  
  DLighting::DLighting(&this->super_DLighting,sector);
  (this->super_DLighting).super_DSectorEffect.super_DThinker.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_00b6d1b8;
  this->m_DarkTime = ltics;
  this->m_BrightTime = utics;
  this->m_MaxLight = (int)sector->lightlevel;
  iVar1 = sector_t::FindMinSurroundingLight(sector,(int)sector->lightlevel);
  this->m_MinLight = iVar1;
  if (this->m_MinLight == this->m_MaxLight) {
    this->m_MinLight = 0;
  }
  if (inSync) {
    local_44 = 1;
  }
  else {
    uVar2 = FRandom::operator()(&pr_strobeflash);
    local_44 = (uVar2 & 7) + 1;
  }
  this->m_Count = local_44;
  return;
}

Assistant:

DStrobe::DStrobe (sector_t *sector, int utics, int ltics, bool inSync)
	: DLighting (sector)
{
	m_DarkTime = ltics;
	m_BrightTime = utics;

	m_MaxLight = sector->lightlevel;
	m_MinLight = sector->FindMinSurroundingLight (sector->lightlevel);

	if (m_MinLight == m_MaxLight)
		m_MinLight = 0;

	m_Count = inSync ? 1 : (pr_strobeflash() & 7) + 1;
}